

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void calc_data_crc(RK_U8 *dat,RK_U32 len,DataCrc *crc)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  RK_U32 val;
  RK_U8 local_24 [4];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (ulong)len + 0x400000003;
  crc->sum_cnt = SUB164(auVar1 * ZEXT816(0x3fffffffd),8) >> 4;
  if (len != 0) {
    wide_bit_sum(dat,len,crc->sum);
  }
  uVar2 = 0;
  if (3 < len) {
    uVar3 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 ^ *(uint *)(dat + uVar3 * 4);
      uVar3 = uVar3 + 1;
    } while (len >> 2 != uVar3);
  }
  if (((len & 3) != 0) && ((len & 3) != 0)) {
    uVar3 = (ulong)(len & 0xfffffffc);
    do {
      local_24[(uint)uVar3 & 3] = dat[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar3 < len);
  }
  crc->len = len;
  crc->vor = uVar2;
  return;
}

Assistant:

void calc_data_crc(RK_U8 *dat, RK_U32 len, DataCrc *crc)
{
    RK_ULONG data_grp_byte_cnt = MAX_HALF_WORD_SUM_CNT * CAL_BYTE;
    RK_U32 i = 0, grp_loop = 0;
    RK_U8 *dat8 = NULL;
    RK_U32 *dat32 = NULL;
    RK_U32 xor = 0;

    /*calc sum */
    crc->sum_cnt = (len + data_grp_byte_cnt - 1) / data_grp_byte_cnt;
    for (grp_loop = 0; grp_loop < len / data_grp_byte_cnt; grp_loop++) {
        wide_bit_sum(&dat[grp_loop * data_grp_byte_cnt], data_grp_byte_cnt, &crc->sum[grp_loop]);
    }
    if (len % data_grp_byte_cnt) {
        wide_bit_sum(&dat[grp_loop * data_grp_byte_cnt], len % data_grp_byte_cnt, &crc->sum[grp_loop]);
    }

    /*calc xor */
    dat32 = (RK_U32 *)dat;
    for (i = 0; i < len / 4; i++)
        xor ^= dat32[i];

    if (len % 4) {
        RK_U32 val = 0;
        dat8 = (RK_U8 *)&val;
        for (i = (len / 4) * 4; i < len; i++)
            dat8[i % 4] = dat[i];
        xor ^= val;
    }

    crc->len = len;
    crc->vor = xor;
}